

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorEmitterAppearance.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::SensorEmitterAppearance::operator!=
          (SensorEmitterAppearance *this,SensorEmitterAppearance *Value)

{
  return *this != *Value;
}

Assistant:

KBOOL SensorEmitterAppearance::operator == ( const SensorEmitterAppearance & Value ) const
{
	// Lets do a single comparison instead of checking every field. 
	// This struct is basically a KUINT32 so lets cast it to one and compare.

	KUINT32 a = *( KUINT32 * )this;
	KUINT32 b = *( KUINT32 * )&Value;

    if( a != b )return false;
    return true;
}